

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O2

bool splitFilePath(string *path,string *directory,string *basename,string *field)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ulong local_80;
  string *local_78;
  string jsonPath;
  string file;
  
  bVar2 = fileExists(path);
  if (bVar2) {
    sVar1 = path->_M_string_length;
    std::__cxx11::string::substr((ulong)&jsonPath,(ulong)path);
    bVar2 = std::operator==(&jsonPath,".json");
    std::__cxx11::string::~string((string *)&jsonPath);
    if (bVar2) {
      iVar3 = std::__cxx11::string::find_last_of((char *)path,0x12c08d);
      if (iVar3 == -1) {
        std::__cxx11::string::assign((char *)directory);
      }
      else {
        std::__cxx11::string::substr((ulong)&jsonPath,(ulong)path);
        std::__cxx11::string::operator=((string *)directory,(string *)&jsonPath);
        std::__cxx11::string::~string((string *)&jsonPath);
      }
      std::__cxx11::string::substr((ulong)&jsonPath,(ulong)path);
      std::__cxx11::string::operator=((string *)basename,(string *)&jsonPath);
      std::__cxx11::string::~string((string *)&jsonPath);
      return true;
    }
    iVar3 = (int)sVar1;
    if (6 < iVar3) {
      std::__cxx11::string::substr((ulong)&jsonPath,(ulong)path);
      bVar2 = std::operator!=(&jsonPath,".dat");
      std::__cxx11::string::~string((string *)&jsonPath);
      if ((!bVar2) &&
         (local_78 = basename, iVar4 = std::__cxx11::string::find_last_of((char *)path,0x12c095),
         iVar4 <= iVar3 + -6 && iVar4 != -1)) {
        jsonPath._M_dataplus._M_p = (pointer)&jsonPath.field_2;
        jsonPath._M_string_length = 0;
        jsonPath.field_2._M_local_buf[0] = '\0';
        do {
          std::__cxx11::string::substr((ulong)&local_a0,(ulong)path);
          std::operator+(&file,&local_a0,".json");
          std::__cxx11::string::operator=((string *)&jsonPath,(string *)&file);
          std::__cxx11::string::~string((string *)&file);
          std::__cxx11::string::~string((string *)&local_a0);
          bVar2 = fileExists(&jsonPath);
          if (bVar2) break;
          iVar4 = std::__cxx11::string::find_last_of((char *)path,0x12c095);
        } while (iVar4 != -1);
        if (iVar4 != -1) {
          uVar5 = std::__cxx11::string::find_last_of((char *)path,0x12c08d);
          file._M_dataplus._M_p = (pointer)&file.field_2;
          file._M_string_length = 0;
          file.field_2._M_local_buf[0] = '\0';
          if ((uVar5 & 0xffffffff) == 0xffffffff) {
            std::__cxx11::string::assign((char *)directory);
            std::__cxx11::string::_M_assign((string *)&file);
          }
          else {
            local_80 = uVar5;
            std::__cxx11::string::substr((ulong)&local_a0,(ulong)path);
            std::__cxx11::string::operator=((string *)directory,(string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::substr((ulong)&local_a0,(ulong)path);
            std::__cxx11::string::operator=((string *)&file,(string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
          }
          std::__cxx11::string::substr((ulong)&local_a0,(ulong)path);
          std::__cxx11::string::operator=((string *)local_78,(string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::substr((ulong)&local_a0,(ulong)path);
          std::__cxx11::string::operator=((string *)field,(string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&file);
        }
        std::__cxx11::string::~string((string *)&jsonPath);
        return iVar4 != -1;
      }
    }
  }
  return false;
}

Assistant:

bool splitFilePath(const std::string& path, std::string& directory, std::string& basename, std::string& field)
{
	if (!fileExists(path))
	{
		return false;
	}

	int size = path.length();

	if (path.substr(size - 5, 5) == ".json")
	{
		int lastSlash = path.find_last_of("/\\");

		if (lastSlash == std::string::npos)
			directory = ".";
		else
			directory = path.substr(0, lastSlash);

		basename = path.substr(lastSlash + 1, size - lastSlash - 6);

		return true;
	}


	if (size < 7)
	{
		return false;
	}

	if (path.substr(size - 4, 4) != ".dat")
	{
		return false;
	}

	int last_ = path.find_last_of("_");
	if (last_ == std::string::npos || last_ > size - 6)
	{
		return false;
	}

	std::string jsonPath;
	do
	{
		jsonPath = path.substr(0, last_) + ".json";
	}
	while (!fileExists(jsonPath) && (last_ = path.find_last_of("_", last_ - 1)) != std::string::npos);

	if (last_ == std::string::npos)
	{
		return false;
	}

	int lastSlash = path.find_last_of("/\\");
	std::string file;

	if (lastSlash == std::string::npos)
	{
		directory = ".";
		file = path;
	}
	else
	{
		directory = path.substr(0, lastSlash);
		file = path.substr(lastSlash + 1);
	}

	basename = path.substr(lastSlash + 1, (last_ - lastSlash) - 1);
	field = path.substr(last_ + 1, size - last_ - 5);

	return true;
}